

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ConfigParse
              (Fts5Global *pGlobal,sqlite3 *db,int nArg,char **azArg,Fts5Config **ppOut,char **pzErr
              )

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  u8 *zRight;
  int iVar5;
  Fts5Config *pFVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  size_t sVar11;
  byte *pbVar12;
  int *piVar13;
  long lVar14;
  char *pcVar15;
  byte bVar16;
  int N;
  uint uVar17;
  byte *pbVar18;
  ulong uVar19;
  ulong uVar20;
  Fts5Config **ppFVar21;
  byte *pbVar22;
  byte *pbVar23;
  bool bVar24;
  int bDummy;
  int rc;
  char *zTwo;
  int bMustBeCol;
  char *zOne;
  uint local_b0;
  uint local_ac;
  char **local_a8;
  Fts5Config *local_a0;
  byte *local_98;
  int local_8c;
  Fts5Buffer local_88;
  char **local_78;
  Fts5Tokenizer **local_70;
  byte *local_68;
  Fts5Global *local_60;
  byte *local_58;
  Fts5Config **local_50;
  ulong local_48;
  fts5_tokenizer **local_40;
  char **local_38;
  
  local_ac = 0;
  local_a8 = pzErr;
  local_60 = pGlobal;
  iVar5 = sqlite3_initialize();
  if (iVar5 == 0) {
    pFVar6 = (Fts5Config *)sqlite3Malloc(0xa8);
  }
  else {
    pFVar6 = (Fts5Config *)0x0;
  }
  *ppOut = pFVar6;
  if (pFVar6 == (Fts5Config *)0x0) {
    return 7;
  }
  memset(pFVar6,0,0xa8);
  pFVar6->db = db;
  pFVar6->iCookie = -1;
  ppcVar7 = (char **)sqlite3Fts5MallocZero((int *)&local_ac,(long)nArg * 9);
  pFVar6->azCol = ppcVar7;
  pFVar6->abUnindexed = (u8 *)(ppcVar7 + nArg);
  pcVar8 = sqlite3Fts5Strndup((int *)&local_ac,azArg[1],-1);
  pFVar6->zDb = pcVar8;
  pcVar8 = sqlite3Fts5Strndup((int *)&local_ac,azArg[2],-1);
  pFVar6->zName = pcVar8;
  pFVar6->bColumnsize = 1;
  pFVar6->eDetail = 0;
  if (pcVar8 != (char *)0x0 && local_ac == 0) {
    lVar10 = 0;
    do {
      bVar16 = pcVar8[lVar10];
      if (bVar16 == "rank"[lVar10]) {
        if ((ulong)bVar16 == 0) goto LAB_001c64eb;
      }
      else if (""[bVar16] != ""[(byte)"rank"[lVar10]]) break;
      lVar10 = lVar10 + 1;
    } while( true );
  }
LAB_001c650c:
  bVar24 = local_ac == 0;
  local_a0 = pFVar6;
  local_50 = ppOut;
  if (nArg < 4 || !bVar24) {
LAB_001c6d0d:
    pFVar6 = local_a0;
    if ((bVar24) && (local_a0->pTok == (Fts5Tokenizer *)0x0)) {
      local_ac = sqlite3Fts5GetTokenizer
                           (local_60,(char **)0x0,0,&local_a0->pTok,&local_a0->pTokApi,(char **)0x0)
      ;
    }
    ppFVar21 = local_50;
    if ((local_ac == 0) && (pFVar6->zContent == (char *)0x0)) {
      if (pFVar6->eContent == 0) {
        pcVar8 = "content";
        bVar24 = false;
      }
      else {
        pcVar8 = (char *)0x0;
        bVar24 = pFVar6->bColumnsize == 0;
        if (!bVar24) {
          pcVar8 = "docsize";
        }
      }
      if (!bVar24) {
        pcVar8 = sqlite3Fts5Mprintf((int *)&local_ac,"%Q.\'%q_%s\'",pFVar6->zDb,pFVar6->zName,pcVar8
                                   );
        pFVar6->zContent = pcVar8;
      }
    }
    if ((local_ac == 0) && (pFVar6->zContentRowid == (char *)0x0)) {
      pcVar8 = sqlite3Fts5Strndup((int *)&local_ac,"rowid",-1);
      pFVar6->zContentRowid = pcVar8;
    }
    if (local_ac == 0) {
      local_98 = (byte *)((ulong)local_98 & 0xffffffff00000000);
      local_88.p = (byte *)0x0;
      local_88.n = 0;
      local_88.nSpace = 0;
      sqlite3Fts5BufferAppendPrintf((int *)&local_98,&local_88,"T.%Q",pFVar6->zContentRowid);
      if ((pFVar6->eContent != 1) && (0 < pFVar6->nCol)) {
        uVar19 = 0;
        do {
          if (pFVar6->eContent == 2) {
            sqlite3Fts5BufferAppendPrintf((int *)&local_98,&local_88,", T.%Q",pFVar6->azCol[uVar19])
            ;
          }
          else {
            sqlite3Fts5BufferAppendPrintf((int *)&local_98,&local_88,", T.c%d",uVar19 & 0xffffffff);
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)pFVar6->nCol);
      }
      pFVar6->zContentExprlist = (char *)local_88.p;
      local_ac = (uint)local_98;
      ppFVar21 = local_50;
    }
    uVar17 = local_ac;
    if (local_ac != 0) {
      sqlite3Fts5ConfigFree(pFVar6);
      *ppFVar21 = (Fts5Config *)0x0;
    }
    return uVar17;
  }
  local_70 = &pFVar6->pTok;
  local_40 = &pFVar6->pTokApi;
  uVar19 = (ulong)(uint)nArg;
  uVar20 = 3;
  local_48 = uVar19;
  local_38 = azArg;
LAB_001c655c:
  local_88.p = (byte *)0x0;
  local_98 = (byte *)0x0;
  local_8c = 0;
  pcVar9 = fts5ConfigGobbleWord((int *)&local_ac,azArg[uVar20],(char **)&local_88,&local_8c);
  pcVar8 = (char *)0x0;
  if (pcVar9 != (char *)0x0) {
    pcVar9 = pcVar9 + -1;
    do {
      pcVar8 = pcVar9 + 1;
      pcVar15 = pcVar9 + 1;
      pcVar9 = pcVar8;
    } while (*pcVar15 == ' ');
  }
  pcVar9 = (char *)0x1;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else if (*pcVar8 == '=') {
    pcVar9 = (char *)0x0;
    pcVar8 = pcVar8 + 1;
    if (local_8c != 0) {
      pcVar8 = pcVar9;
    }
  }
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar15 = pcVar8 + -1;
    do {
      pcVar8 = pcVar15 + 1;
      pcVar1 = pcVar15 + 1;
      pcVar15 = pcVar8;
    } while (*pcVar1 == ' ');
  }
  if (pcVar8 == (char *)0x0) {
LAB_001c660a:
    bVar24 = true;
  }
  else if (*pcVar8 == '\0') {
    bVar24 = false;
  }
  else {
    pcVar8 = fts5ConfigGobbleWord((int *)&local_ac,pcVar8,(char **)&local_98,(int *)&local_b0);
    if (pcVar8 == (char *)0x0) goto LAB_001c660a;
    bVar24 = *pcVar8 != '\0';
  }
  zRight = local_88.p;
  uVar17 = local_ac;
  if (local_ac == 0) {
    if (bVar24) {
      pcVar8 = sqlite3_mprintf("parse error in \"%s\"");
      *local_a8 = pcVar8;
      local_ac = 1;
      uVar17 = local_ac;
      goto LAB_001c6c9a;
    }
    if ((char)pcVar9 == '\0') {
      pbVar22 = local_98;
      if (local_98 == (byte *)0x0) {
        pbVar22 = (byte *)0x1dc0d0;
      }
      local_b0 = 0;
      sVar11 = strlen((char *)local_88.p);
      N = (int)sVar11;
      iVar5 = sqlite3_strnicmp("prefix",(char *)zRight,N);
      if (iVar5 == 0) {
        if (local_a0->aPrefix == (int *)0x0) {
          piVar13 = (int *)sqlite3Fts5MallocZero((int *)&local_b0,0x7c);
          local_a0->aPrefix = piVar13;
          azArg = local_38;
          uVar19 = local_48;
          uVar17 = local_b0;
          if (local_b0 != 0) goto LAB_001c6c9a;
        }
        bVar24 = true;
        do {
          pbVar22 = pbVar22 + -1;
          do {
            bVar16 = pbVar22[1];
            pbVar22 = pbVar22 + 1;
          } while (bVar16 == 0x20);
          if ((bVar24) || (pbVar12 = pbVar22, bVar16 != 0x2c)) {
            if (bVar16 != 0) goto LAB_001c67cc;
            bVar4 = false;
          }
          else {
            do {
              pbVar22 = pbVar12 + 1;
              pbVar18 = pbVar12 + 1;
              pbVar12 = pbVar22;
            } while (*pbVar18 == 0x20);
LAB_001c67cc:
            bVar16 = *pbVar22;
            if ((byte)(bVar16 - 0x3a) < 0xf6) {
              pcVar8 = "malformed prefix=... directive";
LAB_001c67e0:
              pcVar8 = sqlite3_mprintf(pcVar8);
            }
            else {
              if ((long)local_a0->nPrefix != 0x1f) {
                iVar5 = 0;
                if ('/' < (char)bVar16) {
                  iVar5 = 0;
                  do {
                    if ((0x39 < bVar16) || (999 < iVar5)) break;
                    iVar5 = (int)(char)(bVar16 - 0x30) + iVar5 * 10;
                    bVar16 = pbVar22[1];
                    pbVar22 = pbVar22 + 1;
                  } while ('/' < (char)bVar16);
                }
                if (0xfffffc18 < iVar5 - 1000U) {
                  local_a0->aPrefix[local_a0->nPrefix] = iVar5;
                  local_a0->nPrefix = local_a0->nPrefix + 1;
                  bVar24 = false;
                  bVar4 = true;
                  goto LAB_001c6820;
                }
                pcVar8 = "prefix length out of range (max 999)";
                goto LAB_001c67e0;
              }
              pcVar8 = sqlite3_mprintf("too many prefix indexes (max %d)");
            }
            bVar4 = false;
            *local_a8 = pcVar8;
            local_b0 = 1;
          }
LAB_001c6820:
          azArg = local_38;
          uVar19 = local_48;
          uVar17 = local_b0;
        } while (bVar4);
      }
      else {
        iVar5 = sqlite3_strnicmp("tokenize",(char *)zRight,N);
        if (iVar5 == 0) {
          sVar11 = strlen((char *)pbVar22);
          ppcVar7 = (char **)sqlite3Fts5MallocZero((int *)&local_b0,sVar11 * 8 + 8);
          pbVar12 = (byte *)sqlite3Fts5MallocZero((int *)&local_b0,sVar11 * 2 + 2);
          local_68 = pbVar12;
          if (pbVar12 != (byte *)0x0 && ppcVar7 != (char **)0x0) {
            if (*local_70 == (Fts5Tokenizer *)0x0) {
              lVar10 = 0;
              local_78 = ppcVar7;
              do {
                ppcVar7 = local_78;
                if (*pbVar22 == 0) {
                  local_b0 = sqlite3Fts5GetTokenizer
                                       (local_60,local_78,(int)lVar10,local_70,local_40,local_a8);
                  goto LAB_001c6c73;
                }
                pbVar18 = pbVar22 + -1;
                pbVar23 = pbVar22 + -2;
                pbVar22 = pbVar18;
                do {
                  pbVar2 = pbVar22 + 1;
                  pbVar22 = pbVar22 + 1;
                  pbVar23 = pbVar23 + 1;
                  pbVar18 = pbVar18 + 1;
                } while (*pbVar2 == 0x20);
                local_58 = pbVar12;
                if (*pbVar2 == 0x27) {
                  pbVar12 = (byte *)fts5ConfigSkipLiteral((char *)pbVar22);
                }
                else {
                  lVar14 = 0;
                  while (((long)(char)pbVar22[lVar14] < 0 ||
                         ((&DAT_001e2cd0)[(char)pbVar22[lVar14]] != '\0'))) {
                    lVar14 = lVar14 + 1;
                  }
                  pbVar12 = pbVar22 + lVar14;
                  if (lVar14 == 0) {
                    pbVar12 = (byte *)0x0;
                  }
                }
                pbVar2 = local_58;
                if (pbVar12 == (byte *)0x0) {
                  pbVar22 = (byte *)0x0;
                  pbVar12 = local_58;
                }
                else {
                  memcpy(local_58,pbVar22,(long)pbVar12 - (long)pbVar18);
                  local_78[lVar10] = (char *)pbVar2;
                  if ((*pbVar2 - 0x22 < 0x3f) &&
                     ((0x4200000000000021U >> ((ulong)(*pbVar2 - 0x22) & 0x3f) & 1) != 0)) {
                    fts5Dequote((char *)pbVar2);
                  }
                  pbVar22 = pbVar12 + -1;
                  do {
                    pbVar18 = pbVar22 + 1;
                    pbVar22 = pbVar22 + 1;
                  } while (*pbVar18 == 0x20);
                  pbVar12 = pbVar2 + (long)pbVar12 + -(long)pbVar23;
                }
                lVar10 = lVar10 + 1;
              } while (pbVar22 != (byte *)0x0);
              pcVar8 = sqlite3_mprintf("parse error in tokenize directive");
              *local_a8 = pcVar8;
              local_b0 = 1;
              ppcVar7 = local_78;
            }
            else {
              pcVar8 = sqlite3_mprintf("multiple tokenize=... directives");
              *local_a8 = pcVar8;
              local_b0 = 1;
            }
          }
LAB_001c6c73:
          sqlite3_free(ppcVar7);
          sqlite3_free(local_68);
          azArg = local_38;
          uVar19 = local_48;
          uVar17 = local_b0;
        }
        else {
          iVar5 = sqlite3_strnicmp("content",(char *)zRight,N);
          pFVar6 = local_a0;
          if (iVar5 == 0) {
            if (local_a0->eContent == 0) {
              if (*pbVar22 == 0) {
                local_a0->eContent = 1;
                azArg = local_38;
                uVar19 = local_48;
                uVar17 = local_b0;
              }
              else {
                local_a0->eContent = 2;
                pcVar8 = sqlite3Fts5Mprintf((int *)&local_b0,"%Q.%Q",local_a0->zDb,pbVar22);
                pFVar6->zContent = pcVar8;
                azArg = local_38;
                uVar19 = local_48;
                uVar17 = local_b0;
              }
            }
            else {
              pcVar8 = "multiple content=... directives";
LAB_001c6a58:
              pcVar8 = sqlite3_mprintf(pcVar8);
              *local_a8 = pcVar8;
              local_b0 = 1;
              azArg = local_38;
              uVar19 = local_48;
              uVar17 = local_b0;
            }
          }
          else {
            iVar5 = sqlite3_strnicmp("content_rowid",(char *)zRight,N);
            pFVar6 = local_a0;
            if (iVar5 == 0) {
              if (local_a0->zContentRowid != (char *)0x0) {
                pcVar8 = "multiple content_rowid=... directives";
                goto LAB_001c6a58;
              }
              pcVar8 = sqlite3Fts5Strndup((int *)&local_b0,(char *)pbVar22,-1);
              pFVar6->zContentRowid = pcVar8;
              azArg = local_38;
              uVar19 = local_48;
              uVar17 = local_b0;
            }
            else {
              iVar5 = sqlite3_strnicmp("columnsize",(char *)zRight,N);
              if (iVar5 == 0) {
                if (((*pbVar22 & 0xfe) != 0x30) || (pbVar22[1] != 0)) {
                  pcVar8 = "malformed columnsize=... directive";
                  goto LAB_001c6a58;
                }
                local_a0->bColumnsize = (uint)(*pbVar22 == 0x31);
                azArg = local_38;
                uVar19 = local_48;
                uVar17 = local_b0;
              }
              else {
                iVar5 = sqlite3_strnicmp("detail",(char *)zRight,N);
                if (iVar5 == 0) {
                  sVar11 = strlen((char *)pbVar22);
                  uVar17 = 0xffffffff;
                  lVar10 = 0x10;
                  pcVar8 = "none";
                  do {
                    iVar5 = sqlite3_strnicmp(pcVar8,(char *)pbVar22,(int)sVar11);
                    if (iVar5 == 0) {
                      if (-1 < (int)uVar17) {
                        uVar17 = 1;
                        goto LAB_001c6cea;
                      }
                      uVar17 = *(uint *)(&UNK_00211a38 + lVar10);
                    }
                    pcVar8 = *(char **)(&DAT_00211a40 + lVar10);
                    lVar10 = lVar10 + 0x10;
                  } while (lVar10 != 0x40);
                  local_a0->eDetail = uVar17;
                  uVar17 = uVar17 >> 0x1f;
LAB_001c6cea:
                  azArg = local_38;
                  uVar19 = local_48;
                  local_b0 = uVar17;
                  if (uVar17 != 0) {
                    pcVar8 = sqlite3_mprintf("malformed detail=... directive");
                    *local_a8 = pcVar8;
                    azArg = local_38;
                    uVar19 = local_48;
                  }
                }
                else {
                  pcVar8 = sqlite3_mprintf("unrecognized option: \"%.*s\"",sVar11 & 0xffffffff,
                                           zRight);
                  *local_a8 = pcVar8;
                  azArg = local_38;
                  uVar19 = local_48;
                  uVar17 = 1;
                }
              }
            }
          }
        }
      }
      goto LAB_001c6c9a;
    }
    if (local_88.p != (byte *)0x0) {
      lVar10 = 0;
      do {
        bVar16 = local_88.p[lVar10];
        if (bVar16 == "rank"[lVar10]) {
          if ((ulong)bVar16 == 0) goto LAB_001c68e9;
        }
        else if (""[bVar16] != ""[(byte)"rank"[lVar10]]) {
          if (local_88.p == (byte *)0x0) break;
          lVar10 = 0;
          goto LAB_001c6895;
        }
        lVar10 = lVar10 + 1;
      } while( true );
    }
LAB_001c68b7:
    uVar17 = 0;
    if (local_98 != (byte *)0x0) {
      lVar10 = 0;
      do {
        bVar16 = local_98[lVar10];
        bVar3 = "unindexed"[lVar10];
        if (bVar16 == bVar3) {
          if ((ulong)bVar16 == 0) goto LAB_001c68f8;
        }
        else if (""[bVar16] != ""[bVar3]) goto LAB_001c68f8;
        lVar10 = lVar10 + 1;
      } while( true );
    }
    goto LAB_001c69b6;
  }
  goto LAB_001c6c9a;
LAB_001c64eb:
  pcVar8 = sqlite3_mprintf("reserved fts5 table name: %s");
  *local_a8 = pcVar8;
  local_ac = 1;
  goto LAB_001c650c;
LAB_001c6895:
  bVar16 = local_88.p[lVar10];
  if (bVar16 == "SELECT name, rootpage, sql FROM \'%q\'.%s WHERE %s ORDER BY rowid"[lVar10 + 0x3a])
  {
    if ((ulong)bVar16 == 0) goto LAB_001c68e9;
  }
  else if (""[bVar16] !=
           ""[(byte)"SELECT name, rootpage, sql FROM \'%q\'.%s WHERE %s ORDER BY rowid"
                    [lVar10 + 0x3a]]) goto LAB_001c68b7;
  lVar10 = lVar10 + 1;
  goto LAB_001c6895;
LAB_001c68e9:
  pcVar8 = "reserved fts5 column name: %s";
  pbVar22 = local_88.p;
  goto LAB_001c69a2;
LAB_001c68f8:
  if (bVar16 == bVar3) {
    local_a0->abUnindexed[local_a0->nCol] = '\x01';
    uVar17 = 0;
    goto LAB_001c69b6;
  }
  pcVar8 = "unrecognized column option: %s";
  pbVar22 = local_98;
LAB_001c69a2:
  pcVar8 = sqlite3_mprintf(pcVar8,pbVar22);
  *local_a8 = pcVar8;
  uVar17 = 1;
LAB_001c69b6:
  iVar5 = local_a0->nCol;
  local_a0->nCol = iVar5 + 1;
  local_a0->azCol[iVar5] = (char *)zRight;
  local_88.p = (byte *)0x0;
  uVar19 = local_48;
LAB_001c6c9a:
  local_ac = uVar17;
  sqlite3_free(local_88.p);
  sqlite3_free(local_98);
  bVar24 = local_ac == 0;
  if ((!bVar24) || (uVar20 = uVar20 + 1, uVar19 <= uVar20)) goto LAB_001c6d0d;
  goto LAB_001c655c;
}

Assistant:

static int sqlite3Fts5ConfigParse(
  Fts5Global *pGlobal,
  sqlite3 *db,
  int nArg,                       /* Number of arguments */
  const char **azArg,             /* Array of nArg CREATE VIRTUAL TABLE args */
  Fts5Config **ppOut,             /* OUT: Results of parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pRet;               /* New object to return */
  int i;
  sqlite3_int64 nByte;

  *ppOut = pRet = (Fts5Config*)sqlite3_malloc(sizeof(Fts5Config));
  if( pRet==0 ) return SQLITE_NOMEM;
  memset(pRet, 0, sizeof(Fts5Config));
  pRet->db = db;
  pRet->iCookie = -1;

  nByte = nArg * (sizeof(char*) + sizeof(u8));
  pRet->azCol = (char**)sqlite3Fts5MallocZero(&rc, nByte);
  pRet->abUnindexed = (u8*)&pRet->azCol[nArg];
  pRet->zDb = sqlite3Fts5Strndup(&rc, azArg[1], -1);
  pRet->zName = sqlite3Fts5Strndup(&rc, azArg[2], -1);
  pRet->bColumnsize = 1;
  pRet->eDetail = FTS5_DETAIL_FULL;
#ifdef SQLITE_DEBUG
  pRet->bPrefixIndex = 1;
#endif
  if( rc==SQLITE_OK && sqlite3_stricmp(pRet->zName, FTS5_RANK_NAME)==0 ){
    *pzErr = sqlite3_mprintf("reserved fts5 table name: %s", pRet->zName);
    rc = SQLITE_ERROR;
  }

  for(i=3; rc==SQLITE_OK && i<nArg; i++){
    const char *zOrig = azArg[i];
    const char *z;
    char *zOne = 0;
    char *zTwo = 0;
    int bOption = 0;
    int bMustBeCol = 0;

    z = fts5ConfigGobbleWord(&rc, zOrig, &zOne, &bMustBeCol);
    z = fts5ConfigSkipWhitespace(z);
    if( z && *z=='=' ){
      bOption = 1;
      z++;
      if( bMustBeCol ) z = 0;
    }
    z = fts5ConfigSkipWhitespace(z);
    if( z && z[0] ){
      int bDummy;
      z = fts5ConfigGobbleWord(&rc, z, &zTwo, &bDummy);
      if( z && z[0] ) z = 0;
    }

    if( rc==SQLITE_OK ){
      if( z==0 ){
        *pzErr = sqlite3_mprintf("parse error in \"%s\"", zOrig);
        rc = SQLITE_ERROR;
      }else{
        if( bOption ){
          rc = fts5ConfigParseSpecial(pGlobal, pRet, zOne, zTwo?zTwo:"", pzErr);
        }else{
          rc = fts5ConfigParseColumn(pRet, zOne, zTwo, pzErr);
          zOne = 0;
        }
      }
    }

    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }

  /* If a tokenizer= option was successfully parsed, the tokenizer has
  ** already been allocated. Otherwise, allocate an instance of the default
  ** tokenizer (unicode61) now.  */
  if( rc==SQLITE_OK && pRet->pTok==0 ){
    rc = fts5ConfigDefaultTokenizer(pGlobal, pRet);
  }

  /* If no zContent option was specified, fill in the default values. */
  if( rc==SQLITE_OK && pRet->zContent==0 ){
    const char *zTail = 0;
    assert( pRet->eContent==FTS5_CONTENT_NORMAL 
         || pRet->eContent==FTS5_CONTENT_NONE 
    );
    if( pRet->eContent==FTS5_CONTENT_NORMAL ){
      zTail = "content";
    }else if( pRet->bColumnsize ){
      zTail = "docsize";
    }

    if( zTail ){
      pRet->zContent = sqlite3Fts5Mprintf(
          &rc, "%Q.'%q_%s'", pRet->zDb, pRet->zName, zTail
      );
    }
  }

  if( rc==SQLITE_OK && pRet->zContentRowid==0 ){
    pRet->zContentRowid = sqlite3Fts5Strndup(&rc, "rowid", -1);
  }

  /* Formulate the zContentExprlist text */
  if( rc==SQLITE_OK ){
    rc = fts5ConfigMakeExprlist(pRet);
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts5ConfigFree(pRet);
    *ppOut = 0;
  }
  return rc;
}